

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O1

void Timidity::mix_voice(Renderer *song,float *buf,Voice *v,int c)

{
  float fVar1;
  BYTE BVar2;
  int iVar3;
  undefined8 in_RAX;
  float *sp;
  sample_t *psVar4;
  long lVar5;
  int iVar6;
  SDWORD control_ratio;
  final_volume_t *ampat;
  uint uVar7;
  uint uVar8;
  final_volume_t right;
  float fVar9;
  final_volume_t left;
  float fVar10;
  float fVar11;
  float fVar12;
  int count;
  uint local_38;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  _local_38 = CONCAT44(local_34,c);
  if (c < 0) {
    return;
  }
  if ((v->status & 8) != 0) {
    if (0x13 < c) {
      _local_38 = CONCAT44(local_34,0x14);
    }
    psVar4 = resample_voice(song,v,(int *)&local_38);
    uVar7 = 1;
    if (1 < local_38) {
      uVar7 = local_38;
    }
    fVar9 = v->left_mix;
    fVar11 = v->right_mix;
    if (fVar11 == 0.0) {
      fVar11 = -fVar9;
      uVar8 = -(uint)(fVar11 / (float)(int)uVar7 == 0.0);
      lVar5 = 0;
      do {
        fVar9 = fVar9 + (float)(uVar8 & 0xbf800000 | ~uVar8 & (uint)(fVar11 / (float)(int)uVar7));
        if (fVar9 < 0.0) break;
        buf[lVar5 * 2] = psVar4[lVar5] * fVar9 + buf[lVar5 * 2];
        lVar5 = lVar5 + 1;
      } while (local_38 + (local_38 == 0) != (int)lVar5);
    }
    else if (fVar9 == 0.0) {
      fVar9 = -fVar11 / (float)(int)uVar7;
      uVar7 = -(uint)(fVar9 == 0.0);
      lVar5 = 0;
      do {
        fVar11 = fVar11 + (float)(uVar7 & 0xbf800000 | ~uVar7 & (uint)fVar9);
        if (fVar11 < 0.0) break;
        buf[lVar5 * 2 + 1] = psVar4[lVar5 * 2 + 1] * fVar11 + buf[lVar5 * 2 + 1];
        lVar5 = lVar5 + 1;
      } while (local_38 + (local_38 == 0) != (int)lVar5);
    }
    else {
      fVar10 = 1.0 / (float)(int)uVar7;
      fVar12 = -fVar9 * fVar10;
      uVar7 = -(uint)(fVar12 == 0.0);
      fVar10 = fVar10 * fVar11;
      lVar5 = 0;
      do {
        fVar11 = fVar11 - fVar10;
        fVar9 = fVar9 + (float)(uVar7 & 0xbf800000 | ~uVar7 & (uint)fVar12);
        if (0.0 <= fVar9) {
          if (fVar11 < 0.0) {
            fVar11 = 0.0;
          }
        }
        else {
          fVar9 = 0.0;
          if (fVar11 < 0.0) break;
        }
        fVar1 = psVar4[lVar5];
        buf[lVar5 * 2] = fVar1 * fVar9 + buf[lVar5 * 2];
        buf[lVar5 * 2 + 1] = fVar1 * fVar11 + buf[lVar5 * 2 + 1];
        lVar5 = lVar5 + 1;
      } while (local_38 + (local_38 == 0) != (int)lVar5);
    }
    v->status = '\0';
    return;
  }
  sp = resample_voice(song,v,(int *)&local_38);
  uVar7 = local_38;
  if ((int)local_38 < 0) {
    return;
  }
  fVar9 = v->right_mix;
  if (fVar9 == 0.0) {
    if (((v->eg1).field_0.env.bUpdating == '\0') && (v->tremolo_phase_increment == 0)) {
      if (local_38 != 0) {
        fVar9 = v->left_mix;
        lVar5 = 0;
        do {
          buf[lVar5 * 2] = sp[lVar5] * fVar9 + buf[lVar5 * 2];
          lVar5 = lVar5 + 1;
        } while (local_38 != (uint)lVar5);
      }
      goto LAB_003520a9;
    }
    control_ratio = song->control_ratio;
    ampat = &v->left_mix;
  }
  else {
    fVar11 = v->left_mix;
    BVar2 = (v->eg1).field_0.env.bUpdating;
    if (fVar11 != 0.0) {
      if ((BVar2 == '\0') && (v->tremolo_phase_increment == 0)) {
        if (local_38 != 0) {
          lVar5 = 0;
          do {
            fVar10 = sp[lVar5];
            buf[lVar5 * 2] = fVar10 * fVar11 + buf[lVar5 * 2];
            buf[lVar5 * 2 + 1] = fVar10 * fVar9 + buf[lVar5 * 2 + 1];
            lVar5 = lVar5 + 1;
          } while (local_38 != (uint)lVar5);
        }
      }
      else {
        _local_38 = CONCAT44(song->control_ratio,local_38);
        iVar6 = v->control_counter;
        if (v->control_counter != 0) goto LAB_00352240;
        iVar3 = update_signal(v);
        while (iVar6 = local_34, iVar3 == 0) {
LAB_00352240:
          if (uVar7 == 0) break;
          fVar9 = v->left_mix;
          fVar11 = v->right_mix;
          iVar3 = iVar6;
          if ((int)uVar7 <= iVar6) {
            v->control_counter = iVar6 - uVar7;
            lVar5 = 0;
            do {
              fVar10 = sp[lVar5];
              buf[lVar5 * 2] = fVar10 * fVar9 + buf[lVar5 * 2];
              buf[lVar5 * 2 + 1] = fVar10 * fVar11 + buf[lVar5 * 2 + 1];
              lVar5 = lVar5 + 1;
            } while (uVar7 != (uint)lVar5);
            break;
          }
          for (; iVar3 != 0; iVar3 = iVar3 + -1) {
            fVar10 = *sp;
            *buf = fVar10 * fVar9 + *buf;
            buf[1] = fVar10 * fVar11 + buf[1];
            buf = buf + 2;
            sp = sp + 1;
          }
          uVar7 = uVar7 - iVar6;
          iVar3 = update_signal(v);
        }
      }
      goto LAB_003520a9;
    }
    if ((BVar2 == '\0') && (v->tremolo_phase_increment == 0)) {
      if (local_38 != 0) {
        lVar5 = 0;
        do {
          buf[lVar5 * 2 + 1] = sp[lVar5] * fVar9 + buf[lVar5 * 2 + 1];
          lVar5 = lVar5 + 1;
        } while (local_38 != (uint)lVar5);
      }
      goto LAB_003520a9;
    }
    ampat = &v->right_mix;
    control_ratio = song->control_ratio;
    buf = buf + 1;
  }
  mix_single_signal(control_ratio,sp,buf,v,ampat,local_38);
LAB_003520a9:
  v->sample_count = v->sample_count + local_38;
  return;
}

Assistant:

void mix_voice(Renderer *song, float *buf, Voice *v, int c)
{
	int count = c;
	sample_t *sp;
	if (c < 0)
	{
		return;
	}
	if (v->status & VOICE_STOPPING)
	{
		if (count >= MAX_DIE_TIME)
			count = MAX_DIE_TIME;
		sp = resample_voice(song, v, &count);
		ramp_out(sp, buf, v, count);
		v->status = 0;
	}
	else
	{
		sp = resample_voice(song, v, &count);
		if (count < 0)
		{
			return;
		}
		if (v->right_mix == 0)			// All the way to the left
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_left_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_left(sp, buf, v, count);
			}
		}
		else if (v->left_mix == 0)		// All the way to the right
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment != 0)
			{
				mix_single_right_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_single_right(sp, buf, v, count);
			}
		}
		else							// Somewhere in the middle
		{
			if (v->eg1.env.bUpdating || v->tremolo_phase_increment)
			{
				mix_mystery_signal(song->control_ratio, sp, buf, v, count);
			}
			else
			{
				mix_mystery(song->control_ratio, sp, buf, v, count);
			}
		}
		v->sample_count += count;
	}
}